

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * kj::Path::parseWin32Api(Path *__return_storage_ptr__,ArrayPtr<const_wchar_t> text)

{
  size_t capacity;
  size_t extraout_RDX;
  undefined1 in_R9B;
  StringPtr path;
  StringPtr path_00;
  StringPtr local_a8 [2];
  StringPtr local_88;
  Vector<kj::String> local_78;
  wchar_t *local_58;
  size_t sStack_50;
  undefined1 local_40 [8];
  EncodingResult<kj::String> utf8;
  ArrayPtr<const_wchar_t> text_local;
  
  sStack_50 = text.size_;
  local_58 = text.ptr;
  utf8._24_8_ = local_58;
  decodeWideString((EncodingResult<kj::String> *)local_40,text);
  StringPtr::StringPtr(&local_88,(String *)local_40);
  path.content.size_ = extraout_RDX;
  path.content.ptr = (char *)local_88.content.size_;
  capacity = countPartsWin32((Path *)local_88.content.ptr,path);
  Vector<kj::String>::Vector(&local_78,capacity);
  StringPtr::StringPtr(local_a8,(String *)local_40);
  path_00.content.size_ = 1;
  path_00.content.ptr = (char *)local_a8[0].content.size_;
  evalWin32Impl(__return_storage_ptr__,(Path *)&local_78,
                (Vector<kj::String> *)local_a8[0].content.ptr,path_00,(bool)in_R9B);
  Vector<kj::String>::~Vector(&local_78);
  EncodingResult<kj::String>::~EncodingResult((EncodingResult<kj::String> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Path Path::parseWin32Api(ArrayPtr<const wchar_t> text) {
  auto utf8 = decodeWideString(text);
  return evalWin32Impl(Vector<String>(countPartsWin32(utf8)), utf8, true);
}